

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O1

void __thiscall SceneRender::renderShadowMap(SceneRender *this,Uniforms *_uniforms)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  Shader *pSVar33;
  long lVar34;
  Light *this_00;
  mapped_type *ppSVar35;
  mat4 *pmVar36;
  float *pfVar37;
  _Rb_tree_node_base *p_Var38;
  _Base_ptr p_Var39;
  mat<4,_4,_float,_(glm::qualifier)0> Result;
  undefined1 local_198 [8];
  float fStack_190;
  float fStack_18c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  string local_158;
  undefined8 local_138;
  undefined8 uStack_130;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  _Base_ptr local_d0;
  float local_c4;
  Tracker *local_c0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  _Rb_tree_node_base *local_50;
  Model *local_48;
  ShaderMap *local_40;
  _Base_ptr local_38;
  
  if (this->m_shadows == true) {
    local_c0 = &_uniforms->tracker;
    if ((_uniforms->tracker).m_running == true) {
      local_198 = (undefined1  [8])&local_188;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_198,"render:scene:shadowmap","");
      Tracker::begin(local_c0,(string *)local_198);
      if (local_198 != (undefined1  [8])&local_188) {
        operator_delete((void *)local_198,
                        CONCAT44(local_188._M_allocated_capacity._4_4_,
                                 local_188._M_allocated_capacity._0_4_) + 1);
      }
    }
    p_Var39 = (_uniforms->super_Scene).lights._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_38 = &(_uniforms->super_Scene).lights._M_t._M_impl.super__Rb_tree_header._M_header;
    if (p_Var39 != local_38) {
      local_48 = &this->m_floor;
      local_40 = &(this->m_floor).gBuffersShaders;
      local_50 = &(_uniforms->super_Scene).models._M_t._M_impl.super__Rb_tree_header._M_header;
      do {
        if (((this->dynamicShadows != false) || (*(char *)(*(long *)(p_Var39 + 2) + 0x20) != '\0'))
           || ((this->m_origin).bChange == true)) {
          vera::Light::bindShadowMap(*(Light **)(p_Var39 + 2));
          local_198 = (undefined1  [8])&local_188;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"shadow","");
          ppSVar35 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*>_>_>
                     ::operator[](local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_198);
          pSVar33 = *ppSVar35;
          if (local_198 != (undefined1  [8])&local_188) {
            operator_delete((void *)local_198,
                            CONCAT44(local_188._M_allocated_capacity._4_4_,
                                     local_188._M_allocated_capacity._0_4_) + 1);
          }
          if ((pSVar33 != (Shader *)0x0) && ((this->m_floor).m_model_vbo != (Vbo *)0x0)) {
            if ((_uniforms->tracker).m_running == true) {
              local_198 = (undefined1  [8])&local_188;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_198,"render:scene:shadowmap:floor","");
              Tracker::begin(local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_198);
              if (local_198 != (undefined1  [8])&local_188) {
                operator_delete((void *)local_198,
                                CONCAT44(local_188._M_allocated_capacity._4_4_,
                                         local_188._M_allocated_capacity._0_4_) + 1);
              }
            }
            vera::Shader::use(pSVar33);
            (*(_uniforms->super_Scene)._vptr_Scene[0x3e])(_uniforms,pSVar33,0);
            local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_158,"u_modelViewProjectionMatrix","");
            local_88._0_4_ = (this->m_origin).m_transformMatrix.value[0].field_0;
            local_88._4_4_ = (this->m_origin).m_transformMatrix.value[0].field_1;
            uStack_80 = 0;
            local_68._0_4_ = (this->m_origin).m_transformMatrix.value[0].field_2;
            local_68._4_4_ = (this->m_origin).m_transformMatrix.value[0].field_3;
            local_f8._0_4_ = (this->m_origin).m_transformMatrix.value[1].field_0;
            local_f8._4_4_ = (this->m_origin).m_transformMatrix.value[1].field_1;
            uStack_f0 = 0;
            local_108._0_4_ = (this->m_origin).m_transformMatrix.value[1].field_2;
            local_108._4_4_ = (this->m_origin).m_transformMatrix.value[1].field_3;
            local_118._0_4_ = (this->m_origin).m_transformMatrix.value[2].field_0;
            local_118._4_4_ = (this->m_origin).m_transformMatrix.value[2].field_1;
            fVar1 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_0.x;
            fVar2 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_1.y;
            fVar3 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_2.z;
            uStack_60 = 0;
            uStack_100 = 0;
            uStack_110 = 0;
            local_138._0_4_ = (this->m_origin).m_transformMatrix.value[2].field_2;
            local_138._4_4_ = (this->m_origin).m_transformMatrix.value[2].field_3;
            uStack_130 = 0;
            uVar17 = (this->m_origin).m_transformMatrix.value[3].field_0;
            uVar25 = (this->m_origin).m_transformMatrix.value[3].field_1;
            fVar4 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_3.w;
            uVar18 = (this->m_origin).m_transformMatrix.value[3].field_2;
            uVar26 = (this->m_origin).m_transformMatrix.value[3].field_3;
            fStack_190 = (float)uVar18 * fVar4 +
                         (float)(undefined4)local_138 * fVar3 +
                         (float)(undefined4)local_108 * fVar2 + (float)(undefined4)local_68 * fVar1;
            fStack_18c = fVar4 * (float)uVar26 +
                         fVar3 * (float)local_138._4_4_ +
                         fVar2 * (float)local_108._4_4_ + fVar1 * (float)local_68._4_4_;
            fVar5 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_0.x;
            fVar6 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_1.y;
            fVar7 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_2.z;
            fVar8 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_3.w;
            fVar9 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_0.x;
            fVar10 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_1.y;
            fVar11 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_2.z;
            fVar12 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_3.w;
            fVar13 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_0.x;
            fVar14 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_1.y;
            fVar15 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_2.z;
            fVar16 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_3.w;
            local_d0 = (_Base_ptr)CONCAT44(local_d0._4_4_,fVar16);
            local_198._4_4_ =
                 (float)uVar25 * fVar4 +
                 (float)local_118._4_4_ * fVar3 +
                 (float)local_f8._4_4_ * fVar2 + (float)local_88._4_4_ * fVar1;
            local_198._0_4_ =
                 (float)uVar17 * fVar4 +
                 (float)(undefined4)local_118 * fVar3 +
                 (float)(undefined4)local_f8 * fVar2 + (float)(undefined4)local_88 * fVar1;
            local_188._M_allocated_capacity._0_4_ =
                 (float)uVar17 * fVar8 +
                 (float)(undefined4)local_118 * fVar7 +
                 (float)(undefined4)local_f8 * fVar6 + (float)(undefined4)local_88 * fVar5;
            local_188._M_allocated_capacity._4_4_ =
                 (float)uVar25 * fVar8 +
                 (float)local_118._4_4_ * fVar7 +
                 (float)local_f8._4_4_ * fVar6 + (float)local_88._4_4_ * fVar5;
            local_188._8_4_ =
                 (float)uVar18 * fVar8 +
                 (float)(undefined4)local_138 * fVar7 +
                 (float)(undefined4)local_108 * fVar6 + (float)(undefined4)local_68 * fVar5;
            local_188._12_4_ =
                 fVar8 * (float)uVar26 +
                 fVar7 * (float)local_138._4_4_ +
                 fVar6 * (float)local_108._4_4_ + fVar5 * (float)local_68._4_4_;
            local_178 = (float)uVar17 * fVar12 +
                        (float)(undefined4)local_118 * fVar11 +
                        (float)(undefined4)local_f8 * fVar10 + (float)(undefined4)local_88 * fVar9;
            fStack_174 = (float)uVar25 * fVar12 +
                         (float)local_118._4_4_ * fVar11 +
                         (float)local_f8._4_4_ * fVar10 + (float)local_88._4_4_ * fVar9;
            fStack_170 = (float)uVar18 * fVar12 +
                         (float)(undefined4)local_138 * fVar11 +
                         (float)(undefined4)local_108 * fVar10 + (float)(undefined4)local_68 * fVar9
            ;
            fStack_16c = fVar12 * (float)uVar26 +
                         fVar11 * (float)local_138._4_4_ +
                         fVar10 * (float)local_108._4_4_ + fVar9 * (float)local_68._4_4_;
            local_168 = (float)uVar17 * fVar16 +
                        (float)(undefined4)local_118 * fVar15 +
                        (float)(undefined4)local_f8 * fVar14 + (float)(undefined4)local_88 * fVar13;
            fStack_164 = (float)uVar25 * fVar16 +
                         (float)local_118._4_4_ * fVar15 +
                         (float)local_f8._4_4_ * fVar14 + (float)local_88._4_4_ * fVar13;
            fStack_160 = (float)uVar18 * fVar16 +
                         (float)(undefined4)local_138 * fVar15 +
                         (float)(undefined4)local_108 * fVar14 +
                         (float)(undefined4)local_68 * fVar13;
            fStack_15c = (float)uVar26 * fVar16 +
                         (float)local_138._4_4_ * fVar15 +
                         (float)local_108._4_4_ * fVar14 + (float)local_68._4_4_ * fVar13;
            local_128 = (float)local_138._4_4_;
            fStack_124 = (float)local_138._4_4_;
            fStack_120 = (float)local_138._4_4_;
            fStack_11c = (float)local_138._4_4_;
            local_e8 = (float)local_f8._4_4_;
            fStack_e4 = (float)local_f8._4_4_;
            fStack_e0 = (float)local_f8._4_4_;
            fStack_dc = (float)local_f8._4_4_;
            local_b8 = (float)local_68._4_4_;
            fStack_b4 = (float)local_68._4_4_;
            fStack_b0 = (float)local_68._4_4_;
            fStack_ac = (float)local_68._4_4_;
            local_a8 = (float)local_118._4_4_;
            fStack_a4 = (float)local_118._4_4_;
            fStack_a0 = (float)local_118._4_4_;
            fStack_9c = (float)local_118._4_4_;
            local_98 = (float)local_108._4_4_;
            fStack_94 = (float)local_108._4_4_;
            fStack_90 = (float)local_108._4_4_;
            fStack_8c = (float)local_108._4_4_;
            local_78 = (float)local_88._4_4_;
            fStack_74 = (float)local_88._4_4_;
            fStack_70 = (float)local_88._4_4_;
            fStack_6c = (float)local_88._4_4_;
            pmVar36 = vera::Light::getMVPMatrix
                                (*(Light **)(p_Var39 + 2),(mat4 *)local_198,this->m_area);
            vera::Shader::setUniform(pSVar33,&local_158,pmVar36,false);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1
                             );
            }
            local_198 = (undefined1  [8])&local_188;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_198,"u_projectionMatrix","");
            vera::Shader::setUniform
                      (pSVar33,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_198,(mat4 *)(*(long *)(p_Var39 + 2) + 0x148),false);
            if (local_198 != (undefined1  [8])&local_188) {
              operator_delete((void *)local_198,
                              CONCAT44(local_188._M_allocated_capacity._4_4_,
                                       local_188._M_allocated_capacity._0_4_) + 1);
            }
            local_198 = (undefined1  [8])&local_188;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"u_viewMatrix","");
            vera::Shader::setUniform
                      (pSVar33,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_198,(mat4 *)(*(long *)(p_Var39 + 2) + 0x108),false);
            if (local_198 != (undefined1  [8])&local_188) {
              operator_delete((void *)local_198,
                              CONCAT44(local_188._M_allocated_capacity._4_4_,
                                       local_188._M_allocated_capacity._0_4_) + 1);
            }
            local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"u_modelMatrix","")
            ;
            local_88._0_4_ = (this->m_origin).m_transformMatrix.value[0].field_0;
            local_88._4_4_ = (this->m_origin).m_transformMatrix.value[0].field_1;
            uStack_80 = 0;
            local_68._0_4_ = (this->m_origin).m_transformMatrix.value[0].field_2;
            local_68._4_4_ = (this->m_origin).m_transformMatrix.value[0].field_3;
            local_f8._0_4_ = (this->m_origin).m_transformMatrix.value[1].field_0;
            local_f8._4_4_ = (this->m_origin).m_transformMatrix.value[1].field_1;
            uStack_f0 = 0;
            local_108._0_4_ = (this->m_origin).m_transformMatrix.value[1].field_2;
            local_108._4_4_ = (this->m_origin).m_transformMatrix.value[1].field_3;
            local_118._0_4_ = (this->m_origin).m_transformMatrix.value[2].field_0;
            local_118._4_4_ = (this->m_origin).m_transformMatrix.value[2].field_1;
            fVar1 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_0.x;
            fVar2 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_1.y;
            fVar3 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_2.z;
            uStack_60 = 0;
            uStack_100 = 0;
            uStack_110 = 0;
            local_138._0_4_ = (this->m_origin).m_transformMatrix.value[2].field_2;
            local_138._4_4_ = (this->m_origin).m_transformMatrix.value[2].field_3;
            uStack_130 = 0;
            uVar19 = (this->m_origin).m_transformMatrix.value[3].field_0;
            uVar27 = (this->m_origin).m_transformMatrix.value[3].field_1;
            fVar4 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_3.w;
            uVar20 = (this->m_origin).m_transformMatrix.value[3].field_2;
            uVar28 = (this->m_origin).m_transformMatrix.value[3].field_3;
            fStack_190 = (float)uVar20 * fVar4 +
                         (float)(undefined4)local_138 * fVar3 +
                         (float)(undefined4)local_108 * fVar2 + (float)(undefined4)local_68 * fVar1;
            fStack_18c = fVar4 * (float)uVar28 +
                         fVar3 * (float)local_138._4_4_ +
                         fVar2 * (float)local_108._4_4_ + fVar1 * (float)local_68._4_4_;
            fVar5 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_0.x;
            fVar6 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_1.y;
            fVar7 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_2.z;
            fVar8 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_3.w;
            fVar9 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_0.x;
            fVar10 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_1.y;
            fVar11 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_2.z;
            fVar12 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_3.w;
            fVar13 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_0.x;
            fVar14 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_1.y;
            fVar15 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_2.z;
            fVar16 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_3.w;
            local_d0 = (_Base_ptr)CONCAT44(local_d0._4_4_,fVar16);
            local_198._4_4_ =
                 (float)uVar27 * fVar4 +
                 (float)local_118._4_4_ * fVar3 +
                 (float)local_f8._4_4_ * fVar2 + (float)local_88._4_4_ * fVar1;
            local_198._0_4_ =
                 (float)uVar19 * fVar4 +
                 (float)(undefined4)local_118 * fVar3 +
                 (float)(undefined4)local_f8 * fVar2 + (float)(undefined4)local_88 * fVar1;
            local_188._M_allocated_capacity._0_4_ =
                 (float)uVar19 * fVar8 +
                 (float)(undefined4)local_118 * fVar7 +
                 (float)(undefined4)local_f8 * fVar6 + (float)(undefined4)local_88 * fVar5;
            local_188._M_allocated_capacity._4_4_ =
                 (float)uVar27 * fVar8 +
                 (float)local_118._4_4_ * fVar7 +
                 (float)local_f8._4_4_ * fVar6 + (float)local_88._4_4_ * fVar5;
            local_188._8_4_ =
                 (float)uVar20 * fVar8 +
                 (float)(undefined4)local_138 * fVar7 +
                 (float)(undefined4)local_108 * fVar6 + (float)(undefined4)local_68 * fVar5;
            local_188._12_4_ =
                 fVar8 * (float)uVar28 +
                 fVar7 * (float)local_138._4_4_ +
                 fVar6 * (float)local_108._4_4_ + fVar5 * (float)local_68._4_4_;
            local_178 = (float)uVar19 * fVar12 +
                        (float)(undefined4)local_118 * fVar11 +
                        (float)(undefined4)local_f8 * fVar10 + (float)(undefined4)local_88 * fVar9;
            fStack_174 = (float)uVar27 * fVar12 +
                         (float)local_118._4_4_ * fVar11 +
                         (float)local_f8._4_4_ * fVar10 + (float)local_88._4_4_ * fVar9;
            fStack_170 = (float)uVar20 * fVar12 +
                         (float)(undefined4)local_138 * fVar11 +
                         (float)(undefined4)local_108 * fVar10 + (float)(undefined4)local_68 * fVar9
            ;
            fStack_16c = fVar12 * (float)uVar28 +
                         fVar11 * (float)local_138._4_4_ +
                         fVar10 * (float)local_108._4_4_ + fVar9 * (float)local_68._4_4_;
            local_168 = (float)uVar19 * fVar16 +
                        (float)(undefined4)local_118 * fVar15 +
                        (float)(undefined4)local_f8 * fVar14 + (float)(undefined4)local_88 * fVar13;
            fStack_164 = (float)uVar27 * fVar16 +
                         (float)local_118._4_4_ * fVar15 +
                         (float)local_f8._4_4_ * fVar14 + (float)local_88._4_4_ * fVar13;
            fStack_160 = (float)uVar20 * fVar16 +
                         (float)(undefined4)local_138 * fVar15 +
                         (float)(undefined4)local_108 * fVar14 +
                         (float)(undefined4)local_68 * fVar13;
            fStack_15c = (float)uVar28 * fVar16 +
                         (float)local_138._4_4_ * fVar15 +
                         (float)local_108._4_4_ * fVar14 + (float)local_68._4_4_ * fVar13;
            local_128 = (float)local_138._4_4_;
            fStack_124 = (float)local_138._4_4_;
            fStack_120 = (float)local_138._4_4_;
            fStack_11c = (float)local_138._4_4_;
            local_e8 = (float)local_f8._4_4_;
            fStack_e4 = (float)local_f8._4_4_;
            fStack_e0 = (float)local_f8._4_4_;
            fStack_dc = (float)local_f8._4_4_;
            local_b8 = (float)local_68._4_4_;
            fStack_b4 = (float)local_68._4_4_;
            fStack_b0 = (float)local_68._4_4_;
            fStack_ac = (float)local_68._4_4_;
            local_a8 = (float)local_118._4_4_;
            fStack_a4 = (float)local_118._4_4_;
            fStack_a0 = (float)local_118._4_4_;
            fStack_9c = (float)local_118._4_4_;
            local_98 = (float)local_108._4_4_;
            fStack_94 = (float)local_108._4_4_;
            fStack_90 = (float)local_108._4_4_;
            fStack_8c = (float)local_108._4_4_;
            local_78 = (float)local_88._4_4_;
            fStack_74 = (float)local_88._4_4_;
            fStack_70 = (float)local_88._4_4_;
            fStack_6c = (float)local_88._4_4_;
            vera::Shader::setUniform(pSVar33,&local_158,(mat4 *)local_198,false);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1
                             );
            }
            local_198 = (undefined1  [8])&local_188;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"u_model","");
            vera::Shader::setUniform
                      (pSVar33,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_198,
                       (this->m_origin).m_position.field_0.x +
                       (this->m_floor).super_Node.m_position.field_0.x,
                       (this->m_origin).m_position.field_1.y +
                       (this->m_floor).super_Node.m_position.field_1.y,
                       (this->m_origin).m_position.field_2.z +
                       (this->m_floor).super_Node.m_position.field_2.z);
            if (local_198 != (undefined1  [8])&local_188) {
              operator_delete((void *)local_198,
                              CONCAT44(local_188._M_allocated_capacity._4_4_,
                                       local_188._M_allocated_capacity._0_4_) + 1);
            }
            vera::Model::render(local_48,pSVar33);
            if ((_uniforms->tracker).m_running == true) {
              local_198 = (undefined1  [8])&local_188;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_198,"render:scene:shadowmap:floor","");
              Tracker::end(local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_198);
              if (local_198 != (undefined1  [8])&local_188) {
                operator_delete((void *)local_198,
                                CONCAT44(local_188._M_allocated_capacity._4_4_,
                                         local_188._M_allocated_capacity._0_4_) + 1);
              }
            }
          }
          p_Var38 = (_uniforms->super_Scene).models._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_left;
          local_d0 = p_Var39;
          if (p_Var38 != local_50) {
            do {
              lVar34 = *(long *)(p_Var38 + 2);
              local_198 = (undefined1  [8])&local_188;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"shadow","");
              ppSVar35 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*>_>_>
                                       *)(lVar34 + 600),
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_198);
              pSVar33 = *ppSVar35;
              if (local_198 != (undefined1  [8])&local_188) {
                operator_delete((void *)local_198,
                                CONCAT44(local_188._M_allocated_capacity._4_4_,
                                         local_188._M_allocated_capacity._0_4_) + 1);
              }
              if (pSVar33 != (Shader *)0x0) {
                if ((_uniforms->tracker).m_running == true) {
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_198,"render:scene:shadowmap:",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(*(long *)(p_Var38 + 2) + 0x2b0));
                  Tracker::begin(local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_198);
                  if (local_198 != (undefined1  [8])&local_188) {
                    operator_delete((void *)local_198,
                                    CONCAT44(local_188._M_allocated_capacity._4_4_,
                                             local_188._M_allocated_capacity._0_4_) + 1);
                  }
                }
                vera::Shader::use(pSVar33);
                (*(_uniforms->super_Scene)._vptr_Scene[0x3e])(_uniforms,pSVar33,0);
                local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_158,"u_modelViewProjectionMatrix","");
                this_00 = *(Light **)(local_d0 + 2);
                pfVar37 = (float *)(**(code **)(**(long **)(p_Var38 + 2) + 0x100))();
                local_88._0_4_ = (this->m_origin).m_transformMatrix.value[0].field_0;
                local_88._4_4_ = (this->m_origin).m_transformMatrix.value[0].field_1;
                uStack_80 = 0;
                local_68._0_4_ = (this->m_origin).m_transformMatrix.value[0].field_2;
                local_68._4_4_ = (this->m_origin).m_transformMatrix.value[0].field_3;
                local_f8._0_4_ = (this->m_origin).m_transformMatrix.value[1].field_0;
                local_f8._4_4_ = (this->m_origin).m_transformMatrix.value[1].field_1;
                uStack_f0 = 0;
                local_108._0_4_ = (this->m_origin).m_transformMatrix.value[1].field_2;
                local_108._4_4_ = (this->m_origin).m_transformMatrix.value[1].field_3;
                local_118._0_4_ = (this->m_origin).m_transformMatrix.value[2].field_0;
                local_118._4_4_ = (this->m_origin).m_transformMatrix.value[2].field_1;
                fVar1 = *pfVar37;
                fVar2 = pfVar37[1];
                fVar3 = pfVar37[2];
                uStack_60 = 0;
                uStack_100 = 0;
                uStack_110 = 0;
                local_138._0_4_ = (this->m_origin).m_transformMatrix.value[2].field_2;
                local_138._4_4_ = (this->m_origin).m_transformMatrix.value[2].field_3;
                uStack_130 = 0;
                uVar21 = (this->m_origin).m_transformMatrix.value[3].field_0;
                uVar29 = (this->m_origin).m_transformMatrix.value[3].field_1;
                fVar4 = pfVar37[3];
                uVar22 = (this->m_origin).m_transformMatrix.value[3].field_2;
                uVar30 = (this->m_origin).m_transformMatrix.value[3].field_3;
                fStack_190 = (float)uVar22 * fVar4 +
                             (float)(undefined4)local_138 * fVar3 +
                             (float)(undefined4)local_108 * fVar2 +
                             (float)(undefined4)local_68 * fVar1;
                fStack_18c = fVar4 * (float)uVar30 +
                             fVar3 * (float)local_138._4_4_ +
                             fVar2 * (float)local_108._4_4_ + fVar1 * (float)local_68._4_4_;
                fVar5 = pfVar37[4];
                fVar6 = pfVar37[5];
                fVar7 = pfVar37[6];
                fVar8 = pfVar37[7];
                fVar9 = pfVar37[8];
                fVar10 = pfVar37[9];
                fVar11 = pfVar37[10];
                fVar12 = pfVar37[0xb];
                local_c4 = pfVar37[0xc];
                fVar13 = pfVar37[0xd];
                fVar14 = pfVar37[0xe];
                fVar15 = pfVar37[0xf];
                local_198._4_4_ =
                     (float)uVar29 * fVar4 +
                     (float)local_118._4_4_ * fVar3 +
                     (float)local_f8._4_4_ * fVar2 + (float)local_88._4_4_ * fVar1;
                local_198._0_4_ =
                     (float)uVar21 * fVar4 +
                     (float)(undefined4)local_118 * fVar3 +
                     (float)(undefined4)local_f8 * fVar2 + (float)(undefined4)local_88 * fVar1;
                local_188._M_allocated_capacity._0_4_ =
                     (float)uVar21 * fVar8 +
                     (float)(undefined4)local_118 * fVar7 +
                     (float)(undefined4)local_f8 * fVar6 + (float)(undefined4)local_88 * fVar5;
                local_188._M_allocated_capacity._4_4_ =
                     (float)uVar29 * fVar8 +
                     (float)local_118._4_4_ * fVar7 +
                     (float)local_f8._4_4_ * fVar6 + (float)local_88._4_4_ * fVar5;
                local_188._8_4_ =
                     (float)uVar22 * fVar8 +
                     (float)(undefined4)local_138 * fVar7 +
                     (float)(undefined4)local_108 * fVar6 + (float)(undefined4)local_68 * fVar5;
                local_188._12_4_ =
                     fVar8 * (float)uVar30 +
                     fVar7 * (float)local_138._4_4_ +
                     fVar6 * (float)local_108._4_4_ + fVar5 * (float)local_68._4_4_;
                local_178 = (float)uVar21 * fVar12 +
                            (float)(undefined4)local_118 * fVar11 +
                            (float)(undefined4)local_f8 * fVar10 +
                            (float)(undefined4)local_88 * fVar9;
                fStack_174 = (float)uVar29 * fVar12 +
                             (float)local_118._4_4_ * fVar11 +
                             (float)local_f8._4_4_ * fVar10 + (float)local_88._4_4_ * fVar9;
                fStack_170 = (float)uVar22 * fVar12 +
                             (float)(undefined4)local_138 * fVar11 +
                             (float)(undefined4)local_108 * fVar10 +
                             (float)(undefined4)local_68 * fVar9;
                fStack_16c = fVar12 * (float)uVar30 +
                             fVar11 * (float)local_138._4_4_ +
                             fVar10 * (float)local_108._4_4_ + fVar9 * (float)local_68._4_4_;
                local_168 = (float)uVar21 * fVar15 +
                            (float)(undefined4)local_118 * fVar14 +
                            (float)(undefined4)local_f8 * fVar13 +
                            (float)(undefined4)local_88 * local_c4;
                fStack_164 = (float)uVar29 * fVar15 +
                             (float)local_118._4_4_ * fVar14 +
                             (float)local_f8._4_4_ * fVar13 + (float)local_88._4_4_ * local_c4;
                fStack_160 = (float)uVar22 * fVar15 +
                             (float)(undefined4)local_138 * fVar14 +
                             (float)(undefined4)local_108 * fVar13 +
                             (float)(undefined4)local_68 * local_c4;
                fStack_15c = (float)uVar30 * fVar15 +
                             (float)local_138._4_4_ * fVar14 +
                             (float)local_108._4_4_ * fVar13 + (float)local_68._4_4_ * local_c4;
                local_128 = (float)local_138._4_4_;
                fStack_124 = (float)local_138._4_4_;
                fStack_120 = (float)local_138._4_4_;
                fStack_11c = (float)local_138._4_4_;
                local_e8 = (float)local_f8._4_4_;
                fStack_e4 = (float)local_f8._4_4_;
                fStack_e0 = (float)local_f8._4_4_;
                fStack_dc = (float)local_f8._4_4_;
                local_b8 = (float)local_68._4_4_;
                fStack_b4 = (float)local_68._4_4_;
                fStack_b0 = (float)local_68._4_4_;
                fStack_ac = (float)local_68._4_4_;
                local_a8 = (float)local_118._4_4_;
                fStack_a4 = (float)local_118._4_4_;
                fStack_a0 = (float)local_118._4_4_;
                fStack_9c = (float)local_118._4_4_;
                local_98 = (float)local_108._4_4_;
                fStack_94 = (float)local_108._4_4_;
                fStack_90 = (float)local_108._4_4_;
                fStack_8c = (float)local_108._4_4_;
                local_78 = (float)local_88._4_4_;
                fStack_74 = (float)local_88._4_4_;
                fStack_70 = (float)local_88._4_4_;
                fStack_6c = (float)local_88._4_4_;
                pmVar36 = vera::Light::getMVPMatrix(this_00,(mat4 *)local_198,this->m_area);
                vera::Shader::setUniform(pSVar33,&local_158,pmVar36,false);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_158._M_dataplus._M_p != &local_158.field_2) {
                  operator_delete(local_158._M_dataplus._M_p,
                                  local_158.field_2._M_allocated_capacity + 1);
                }
                local_198 = (undefined1  [8])&local_188;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_198,"u_projectionMatrix","");
                p_Var39 = local_d0;
                vera::Shader::setUniform
                          (pSVar33,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_198,(mat4 *)(*(long *)(local_d0 + 2) + 0x148),false);
                if (local_198 != (undefined1  [8])&local_188) {
                  operator_delete((void *)local_198,
                                  CONCAT44(local_188._M_allocated_capacity._4_4_,
                                           local_188._M_allocated_capacity._0_4_) + 1);
                }
                local_198 = (undefined1  [8])&local_188;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_198,"u_viewMatrix","");
                vera::Shader::setUniform
                          (pSVar33,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_198,(mat4 *)(*(long *)(p_Var39 + 2) + 0x108),false);
                if (local_198 != (undefined1  [8])&local_188) {
                  operator_delete((void *)local_198,
                                  CONCAT44(local_188._M_allocated_capacity._4_4_,
                                           local_188._M_allocated_capacity._0_4_) + 1);
                }
                local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_158,"u_modelMatrix","");
                pfVar37 = (float *)(**(code **)(**(long **)(p_Var38 + 2) + 0x100))();
                local_88._0_4_ = (this->m_origin).m_transformMatrix.value[0].field_0;
                local_88._4_4_ = (this->m_origin).m_transformMatrix.value[0].field_1;
                uStack_80 = 0;
                local_68._0_4_ = (this->m_origin).m_transformMatrix.value[0].field_2;
                local_68._4_4_ = (this->m_origin).m_transformMatrix.value[0].field_3;
                local_f8._0_4_ = (this->m_origin).m_transformMatrix.value[1].field_0;
                local_f8._4_4_ = (this->m_origin).m_transformMatrix.value[1].field_1;
                uStack_f0 = 0;
                local_108._0_4_ = (this->m_origin).m_transformMatrix.value[1].field_2;
                local_108._4_4_ = (this->m_origin).m_transformMatrix.value[1].field_3;
                local_118._0_4_ = (this->m_origin).m_transformMatrix.value[2].field_0;
                local_118._4_4_ = (this->m_origin).m_transformMatrix.value[2].field_1;
                fVar1 = *pfVar37;
                fVar2 = pfVar37[1];
                fVar3 = pfVar37[2];
                uStack_60 = 0;
                uStack_100 = 0;
                uStack_110 = 0;
                local_138._0_4_ = (this->m_origin).m_transformMatrix.value[2].field_2;
                local_138._4_4_ = (this->m_origin).m_transformMatrix.value[2].field_3;
                uStack_130 = 0;
                uVar23 = (this->m_origin).m_transformMatrix.value[3].field_0;
                uVar31 = (this->m_origin).m_transformMatrix.value[3].field_1;
                fVar4 = pfVar37[3];
                uVar24 = (this->m_origin).m_transformMatrix.value[3].field_2;
                uVar32 = (this->m_origin).m_transformMatrix.value[3].field_3;
                fStack_190 = (float)uVar24 * fVar4 +
                             (float)(undefined4)local_138 * fVar3 +
                             (float)(undefined4)local_108 * fVar2 +
                             (float)(undefined4)local_68 * fVar1;
                fStack_18c = fVar4 * (float)uVar32 +
                             fVar3 * (float)local_138._4_4_ +
                             fVar2 * (float)local_108._4_4_ + fVar1 * (float)local_68._4_4_;
                fVar5 = pfVar37[4];
                fVar6 = pfVar37[5];
                fVar7 = pfVar37[6];
                fVar8 = pfVar37[7];
                fVar9 = pfVar37[8];
                fVar10 = pfVar37[9];
                fVar11 = pfVar37[10];
                fVar12 = pfVar37[0xb];
                local_c4 = pfVar37[0xc];
                fVar13 = pfVar37[0xd];
                fVar14 = pfVar37[0xe];
                fVar15 = pfVar37[0xf];
                local_198._4_4_ =
                     (float)uVar31 * fVar4 +
                     (float)local_118._4_4_ * fVar3 +
                     (float)local_f8._4_4_ * fVar2 + (float)local_88._4_4_ * fVar1;
                local_198._0_4_ =
                     (float)uVar23 * fVar4 +
                     (float)(undefined4)local_118 * fVar3 +
                     (float)(undefined4)local_f8 * fVar2 + (float)(undefined4)local_88 * fVar1;
                local_188._M_allocated_capacity._0_4_ =
                     (float)uVar23 * fVar8 +
                     (float)(undefined4)local_118 * fVar7 +
                     (float)(undefined4)local_f8 * fVar6 + (float)(undefined4)local_88 * fVar5;
                local_188._M_allocated_capacity._4_4_ =
                     (float)uVar31 * fVar8 +
                     (float)local_118._4_4_ * fVar7 +
                     (float)local_f8._4_4_ * fVar6 + (float)local_88._4_4_ * fVar5;
                local_188._8_4_ =
                     (float)uVar24 * fVar8 +
                     (float)(undefined4)local_138 * fVar7 +
                     (float)(undefined4)local_108 * fVar6 + (float)(undefined4)local_68 * fVar5;
                local_188._12_4_ =
                     fVar8 * (float)uVar32 +
                     fVar7 * (float)local_138._4_4_ +
                     fVar6 * (float)local_108._4_4_ + fVar5 * (float)local_68._4_4_;
                local_178 = (float)uVar23 * fVar12 +
                            (float)(undefined4)local_118 * fVar11 +
                            (float)(undefined4)local_f8 * fVar10 +
                            (float)(undefined4)local_88 * fVar9;
                fStack_174 = (float)uVar31 * fVar12 +
                             (float)local_118._4_4_ * fVar11 +
                             (float)local_f8._4_4_ * fVar10 + (float)local_88._4_4_ * fVar9;
                fStack_170 = (float)uVar24 * fVar12 +
                             (float)(undefined4)local_138 * fVar11 +
                             (float)(undefined4)local_108 * fVar10 +
                             (float)(undefined4)local_68 * fVar9;
                fStack_16c = fVar12 * (float)uVar32 +
                             fVar11 * (float)local_138._4_4_ +
                             fVar10 * (float)local_108._4_4_ + fVar9 * (float)local_68._4_4_;
                local_168 = (float)uVar23 * fVar15 +
                            (float)(undefined4)local_118 * fVar14 +
                            (float)(undefined4)local_f8 * fVar13 +
                            (float)(undefined4)local_88 * local_c4;
                fStack_164 = (float)uVar31 * fVar15 +
                             (float)local_118._4_4_ * fVar14 +
                             (float)local_f8._4_4_ * fVar13 + (float)local_88._4_4_ * local_c4;
                fStack_160 = (float)uVar24 * fVar15 +
                             (float)(undefined4)local_138 * fVar14 +
                             (float)(undefined4)local_108 * fVar13 +
                             (float)(undefined4)local_68 * local_c4;
                fStack_15c = (float)uVar32 * fVar15 +
                             (float)local_138._4_4_ * fVar14 +
                             (float)local_108._4_4_ * fVar13 + (float)local_68._4_4_ * local_c4;
                local_128 = (float)local_138._4_4_;
                fStack_124 = (float)local_138._4_4_;
                fStack_120 = (float)local_138._4_4_;
                fStack_11c = (float)local_138._4_4_;
                local_e8 = (float)local_f8._4_4_;
                fStack_e4 = (float)local_f8._4_4_;
                fStack_e0 = (float)local_f8._4_4_;
                fStack_dc = (float)local_f8._4_4_;
                local_b8 = (float)local_68._4_4_;
                fStack_b4 = (float)local_68._4_4_;
                fStack_b0 = (float)local_68._4_4_;
                fStack_ac = (float)local_68._4_4_;
                local_a8 = (float)local_118._4_4_;
                fStack_a4 = (float)local_118._4_4_;
                fStack_a0 = (float)local_118._4_4_;
                fStack_9c = (float)local_118._4_4_;
                local_98 = (float)local_108._4_4_;
                fStack_94 = (float)local_108._4_4_;
                fStack_90 = (float)local_108._4_4_;
                fStack_8c = (float)local_108._4_4_;
                local_78 = (float)local_88._4_4_;
                fStack_74 = (float)local_88._4_4_;
                fStack_70 = (float)local_88._4_4_;
                fStack_6c = (float)local_88._4_4_;
                vera::Shader::setUniform(pSVar33,&local_158,(mat4 *)local_198,false);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_158._M_dataplus._M_p != &local_158.field_2) {
                  operator_delete(local_158._M_dataplus._M_p,
                                  local_158.field_2._M_allocated_capacity + 1);
                }
                local_198 = (undefined1  [8])&local_188;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"u_model","");
                pfVar37 = (float *)(**(code **)(**(long **)(p_Var38 + 2) + 0x98))();
                vera::Shader::setUniform
                          (pSVar33,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_198,(this->m_origin).m_position.field_0.x + *pfVar37,
                           (this->m_origin).m_position.field_1.y + pfVar37[1],
                           (this->m_origin).m_position.field_2.z + pfVar37[2]);
                if (local_198 != (undefined1  [8])&local_188) {
                  operator_delete((void *)local_198,
                                  CONCAT44(local_188._M_allocated_capacity._4_4_,
                                           local_188._M_allocated_capacity._0_4_) + 1);
                }
                vera::Model::render(*(Model **)(p_Var38 + 2),pSVar33);
                if ((_uniforms->tracker).m_running == true) {
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_198,"render:scene:shadowmap:",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(*(long *)(p_Var38 + 2) + 0x2b0));
                  Tracker::end(local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_198);
                  if (local_198 != (undefined1  [8])&local_188) {
                    operator_delete((void *)local_198,
                                    CONCAT44(local_188._M_allocated_capacity._4_4_,
                                             local_188._M_allocated_capacity._0_4_) + 1);
                  }
                }
              }
              p_Var38 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var38);
            } while (p_Var38 != local_50);
          }
          p_Var39 = local_d0;
          vera::Light::unbindShadowMap(*(Light **)(local_d0 + 2));
        }
        p_Var39 = (_Base_ptr)std::_Rb_tree_increment(p_Var39);
      } while (p_Var39 != local_38);
    }
    if ((_uniforms->tracker).m_running != false) {
      local_198 = (undefined1  [8])&local_188;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"shadowmap","");
      Tracker::end(local_c0,(string *)local_198);
      if (local_198 != (undefined1  [8])&local_188) {
        operator_delete((void *)local_198,
                        CONCAT44(local_188._M_allocated_capacity._4_4_,
                                 local_188._M_allocated_capacity._0_4_) + 1);
      }
    }
  }
  return;
}

Assistant:

void SceneRender::renderShadowMap(Uniforms& _uniforms) {
    if (!m_shadows)
        return;

    TRACK_BEGIN("render:scene:shadowmap")
    vera::Shader* shadowShader = nullptr;
    for (vera::LightsMap::iterator lit = _uniforms.lights.begin(); lit != _uniforms.lights.end(); ++lit) {
        if (dynamicShadows ||  lit->second->bChange || haveChange() ) {
            // Temporally move the MVP matrix from the view of the light 
            glm::mat4 m = m_origin.getTransformMatrix();
            // glm::mat4 p = lit->second->getProjectionMatrix();
            // glm::mat4 v = lit->second->getViewMatrix();
            
            lit->second->bindShadowMap();

            shadowShader = m_floor.getBufferShader("shadow");
            if (m_floor.getVbo() && shadowShader != nullptr) {
                TRACK_BEGIN("render:scene:shadowmap:floor")
                shadowShader->use();
                _uniforms.feedTo( shadowShader, false );
                shadowShader->setUniform( "u_modelViewProjectionMatrix", lit->second->getMVPMatrix( m_origin.getTransformMatrix() * m_floor.getTransformMatrix(), m_area ) );
                shadowShader->setUniform( "u_projectionMatrix", lit->second->getProjectionMatrix() );
                shadowShader->setUniform( "u_viewMatrix", lit->second->getViewMatrix() );
                shadowShader->setUniform( "u_modelMatrix", m_origin.getTransformMatrix() * m_floor.getTransformMatrix() );
                shadowShader->setUniform( "u_model", m_origin.getPosition() + m_floor.getPosition() );
                m_floor.render(shadowShader);
                TRACK_END("render:scene:shadowmap:floor")
            }

            for (vera::ModelsMap::iterator mit = _uniforms.models.begin(); mit != _uniforms.models.end(); ++mit) {
                shadowShader = mit->second->getBufferShader("shadow");
                if (shadowShader != nullptr) {
                    TRACK_BEGIN("render:scene:shadowmap:" + mit->second->getName())

                    // bind the shader
                    shadowShader->use();

                    // Update Uniforms and textures variables to the shader
                    _uniforms.feedTo( shadowShader, false );

                    // Pass special uniforms
                    shadowShader->setUniform( "u_modelViewProjectionMatrix", lit->second->getMVPMatrix( m_origin.getTransformMatrix() * mit->second->getTransformMatrix(), m_area ) );
                    shadowShader->setUniform( "u_projectionMatrix", lit->second->getProjectionMatrix() );
                    shadowShader->setUniform( "u_viewMatrix", lit->second->getViewMatrix() );
                    shadowShader->setUniform( "u_modelMatrix", m_origin.getTransformMatrix() * mit->second->getTransformMatrix() );
                    shadowShader->setUniform( "u_model", m_origin.getPosition() + mit->second->getPosition() );
                    mit->second->render(shadowShader);

                    TRACK_END("render:scene:shadowmap:" + mit->second->getName())
                }
            }

            lit->second->unbindShadowMap();
        }
    }
    TRACK_END("shadowmap")
}